

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O2

bool google::protobuf::compiler::cpp::anon_unknown_0::IsCrossFileMaybeMap(FieldDescriptor *field)

{
  bool bVar1;
  Descriptor *this;
  FieldDescriptor *field_00;
  
  bVar1 = FieldDescriptor::is_map(field);
  if (bVar1) {
    this = FieldDescriptor::message_type(field);
    field_00 = Descriptor::FindFieldByNumber(this,2);
    bVar1 = IsCrossFileMessage(field_00);
    if (bVar1) {
      return true;
    }
  }
  bVar1 = IsCrossFileMessage(field);
  return bVar1;
}

Assistant:

bool IsCrossFileMaybeMap(const FieldDescriptor* field) {
  if (IsCrossFileMapField(field)) {
    return true;
  }

  return IsCrossFileMessage(field);
}